

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

size_t http_date2rfc2109(char *target,tm_conflict *tmbuf)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  uint16_t tmp;
  char *pos;
  tm_conflict *tmbuf_local;
  char *target_local;
  
  *target = *DAY_NAMES[tmbuf->tm_wday];
  target[1] = DAY_NAMES[tmbuf->tm_wday][1];
  target[2] = DAY_NAMES[tmbuf->tm_wday][2];
  target[3] = ',';
  target[4] = ' ';
  cVar1 = (char)(tmbuf->tm_mday / 10);
  target[5] = cVar1 + '0';
  target[6] = (char)tmbuf->tm_mday + cVar1 * -10 + '0';
  target[7] = ' ';
  target[8] = *MONTH_NAMES[tmbuf->tm_mon];
  target[9] = MONTH_NAMES[tmbuf->tm_mon][1];
  target[10] = MONTH_NAMES[tmbuf->tm_mon][2];
  target[0xb] = ' ';
  sVar2 = fio_ltoa(target + 0xc,(long)(tmbuf->tm_year + 0x76c),'\n');
  pcVar3 = target + 0xc + sVar2;
  *pcVar3 = ' ';
  cVar1 = (char)(tmbuf->tm_hour / 10);
  pcVar3[1] = cVar1 + '0';
  pcVar3[2] = (char)tmbuf->tm_hour + cVar1 * -10 + '0';
  pcVar3[3] = ':';
  cVar1 = (char)(tmbuf->tm_min / 10);
  pcVar3[4] = cVar1 + '0';
  pcVar3[5] = (char)tmbuf->tm_min + cVar1 * -10 + '0';
  pcVar3[6] = ':';
  cVar1 = (char)(tmbuf->tm_sec / 10);
  pcVar3[7] = cVar1 + '0';
  pcVar3[8] = (char)tmbuf->tm_sec + cVar1 * -10 + '0';
  pcVar3[9] = ' ';
  pcVar3[10] = '-';
  pcVar3[0xb] = '0';
  pcVar3[0xc] = '0';
  pcVar3[0xd] = '0';
  pcVar3[0xe] = '0';
  pcVar3[0xf] = '\0';
  return (long)(pcVar3 + 0xf) - (long)target;
}

Assistant:

size_t http_date2rfc2109(char *target, struct tm *tmbuf) {
  /* note: day of month is always 2 digits */
  char *pos = target;
  uint16_t tmp;
  pos[0] = DAY_NAMES[tmbuf->tm_wday][0];
  pos[1] = DAY_NAMES[tmbuf->tm_wday][1];
  pos[2] = DAY_NAMES[tmbuf->tm_wday][2];
  pos[3] = ',';
  pos[4] = ' ';
  pos += 5;
  tmp = tmbuf->tm_mday / 10;
  pos[0] = '0' + tmp;
  pos[1] = '0' + (tmbuf->tm_mday - (tmp * 10));
  pos += 2;
  *(pos++) = ' ';
  pos[0] = MONTH_NAMES[tmbuf->tm_mon][0];
  pos[1] = MONTH_NAMES[tmbuf->tm_mon][1];
  pos[2] = MONTH_NAMES[tmbuf->tm_mon][2];
  pos[3] = ' ';
  pos += 4;
  // write year.
  pos += fio_ltoa(pos, tmbuf->tm_year + 1900, 10);
  *(pos++) = ' ';
  tmp = tmbuf->tm_hour / 10;
  pos[0] = '0' + tmp;
  pos[1] = '0' + (tmbuf->tm_hour - (tmp * 10));
  pos[2] = ':';
  tmp = tmbuf->tm_min / 10;
  pos[3] = '0' + tmp;
  pos[4] = '0' + (tmbuf->tm_min - (tmp * 10));
  pos[5] = ':';
  tmp = tmbuf->tm_sec / 10;
  pos[6] = '0' + tmp;
  pos[7] = '0' + (tmbuf->tm_sec - (tmp * 10));
  pos += 8;
  *pos++ = ' ';
  *pos++ = '-';
  *pos++ = '0';
  *pos++ = '0';
  *pos++ = '0';
  *pos++ = '0';
  *pos = 0;
  return pos - target;
}